

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

CURLcode error_do_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  CURLcode CVar1;
  char all [256];
  char acStack_128 [256];
  
  Curl_all_content_encodings(acStack_128,0x100);
  if ((type & 1U) == 0) {
    CVar1 = Curl_cwriter_write(data,writer->next,type,buf,nbytes);
  }
  else {
    Curl_failf(data,"Unrecognized content encoding type. libcurl understands %s content encodings.",
               acStack_128);
    CVar1 = CURLE_BAD_CONTENT_ENCODING;
  }
  return CVar1;
}

Assistant:

static CURLcode error_do_write(struct Curl_easy *data,
                                     struct Curl_cwriter *writer, int type,
                                     const char *buf, size_t nbytes)
{
  char all[256];
  (void)Curl_all_content_encodings(all, sizeof(all));

  (void) writer;
  (void) buf;
  (void) nbytes;

  if(!(type & CLIENTWRITE_BODY))
    return Curl_cwriter_write(data, writer->next, type, buf, nbytes);

  failf(data, "Unrecognized content encoding type. "
        "libcurl understands %s content encodings.", all);
  return CURLE_BAD_CONTENT_ENCODING;
}